

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_decoding.cc
# Opt level: O0

void __thiscall sptk::HuffmanDecoding::HuffmanDecoding(HuffmanDecoding *this,ifstream *input_stream)

{
  char cVar1;
  bool bVar2;
  void *pvVar3;
  istream *piVar4;
  reference pcVar5;
  istream *in_RSI;
  undefined8 *in_RDI;
  Node *next_node;
  bool right;
  char *bit;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  Node *node;
  string bits;
  int symbol;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string *local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  string local_40 [32];
  int local_20 [4];
  istream *local_10;
  
  *in_RDI = &PTR__HuffmanDecoding_00125cc8;
  *(undefined1 *)(in_RDI + 1) = 1;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  if (in_RSI == (istream *)0x0) {
    *(undefined1 *)(in_RDI + 1) = 0;
  }
  else {
    local_10 = in_RSI;
    pvVar3 = operator_new(0x18);
    in_RDI[2] = pvVar3;
    *(undefined8 *)in_RDI[2] = 0;
    *(undefined8 *)(in_RDI[2] + 8) = 0;
    std::__cxx11::string::string(local_40);
    while( true ) {
      piVar4 = (istream *)std::istream::operator>>(local_10,local_20);
      piVar4 = std::operator>>(piVar4,local_40);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      local_48 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_RDI[2];
      local_50 = local_40;
      local_58._M_current = (char *)std::__cxx11::string::begin();
      std::__cxx11::string::end();
      while (bVar2 = __gnu_cxx::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48),
            bVar2) {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        cVar1 = *pcVar5;
        if (cVar1 != '1') {
          local_a8 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_48->_M_current;
        }
        else {
          local_a8 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_48[1]._M_current;
        }
        local_78 = local_a8;
        if (local_a8 ==
            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          in_stack_ffffffffffffff50 =
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x18);
          in_stack_ffffffffffffff50->_M_current = (char *)0x0;
          in_stack_ffffffffffffff50[1]._M_current = (char *)0x0;
          local_78 = in_stack_ffffffffffffff50;
          if (cVar1 != '1') {
            local_48->_M_current = (char *)in_stack_ffffffffffffff50;
          }
          else {
            local_48[1]._M_current = (char *)in_stack_ffffffffffffff50;
          }
        }
        local_48 = local_78;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_58);
      }
      *(int *)&local_48[2]._M_current = local_20[0];
    }
    std::__cxx11::string::~string(local_40);
    in_RDI[3] = in_RDI[2];
  }
  return;
}

Assistant:

HuffmanDecoding::HuffmanDecoding(std::ifstream* input_stream)
    : is_valid_(true), root_(NULL), curr_node_(NULL) {
  if (NULL == input_stream) {
    is_valid_ = false;
    return;
  }

  try {
    root_ = new Node;
    root_->left = NULL;
    root_->right = NULL;

    int symbol;
    std::string bits;
    while (*input_stream >> symbol >> bits) {
      Node* node(root_);
      for (const char& bit : bits) {
        const bool right('1' == bit ? true : false);
        Node* next_node(right ? node->right : node->left);
        if (NULL == next_node) {
          next_node = new Node;
          next_node->left = NULL;
          next_node->right = NULL;
          if (right) {
            node->right = next_node;
          } else {
            node->left = next_node;
          }
        }
        node = next_node;
      }
      node->symbol = symbol;
    }
  } catch (...) {
    Free(root_);
    is_valid_ = false;
    return;
  }

  curr_node_ = root_;
}